

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O0

void __thiscall lsim::SimComponent::enable_user_values(SimComponent *this)

{
  size_type __new_size;
  value_type local_14;
  SimComponent *local_10;
  SimComponent *this_local;
  
  local_10 = this;
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::clear(&this->m_user_values);
  __new_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pins);
  local_14 = VALUE_UNDEFINED;
  std::vector<lsim::Value,_std::allocator<lsim::Value>_>::resize
            (&this->m_user_values,__new_size,&local_14);
  return;
}

Assistant:

void SimComponent::enable_user_values() {
	m_user_values.clear();
	m_user_values.resize(m_pins.size(), VALUE_UNDEFINED);
}